

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu511.c
# Opt level: O2

MPP_RET hal_h264e_vepu511_start(void *hal,HalEncTask *task)

{
  void *pvVar1;
  MPP_RET MVar2;
  MPP_RET MVar3;
  char *fmt;
  ulong uVar4;
  MppDevRegWrCfg wr_cfg;
  MppDevRegRdCfg rd_cfg;
  
  pvVar1 = *(void **)((long)hal + 400);
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu511","enter %p\n","hal_h264e_vepu511_start",hal);
  }
  wr_cfg.size = 0x124;
  wr_cfg.offset = 0;
  wr_cfg.reg = pvVar1;
  MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,&wr_cfg);
  if (MVar2 == MPP_OK) {
    wr_cfg.reg = (void *)((long)pvVar1 + 0x124);
    wr_cfg.size = 0x2cc;
    wr_cfg.offset = 0x270;
    MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,&wr_cfg);
    if (MVar2 != MPP_OK) goto LAB_002230ab;
    wr_cfg.reg = (void *)((long)pvVar1 + 0x3f0);
    wr_cfg.size = 0x164;
    wr_cfg.offset = 0x1000;
    MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,&wr_cfg);
    if (MVar2 != MPP_OK) goto LAB_002230ab;
    wr_cfg.reg = (void *)((long)pvVar1 + 0x554);
    wr_cfg.size = 0x2cc;
    wr_cfg.offset = 0x1700;
    MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,&wr_cfg);
    if (MVar2 != MPP_OK) goto LAB_002230ab;
    wr_cfg.reg = (void *)((long)pvVar1 + 0x820);
    wr_cfg.size = 0x16c;
    wr_cfg.offset = 0x2000;
    MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,&wr_cfg);
    if (MVar2 != MPP_OK) goto LAB_002230ab;
    wr_cfg.reg = (void *)((long)pvVar1 + 0x98c);
    wr_cfg.size = 0x490;
    wr_cfg.offset = 0x2200;
    MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,&wr_cfg);
    if (MVar2 != MPP_OK) goto LAB_002230ab;
    wr_cfg.reg = (void *)((long)pvVar1 + 0xe1c);
    wr_cfg.size = 0x268;
    wr_cfg.offset = 0x3000;
    MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,&wr_cfg);
    if (MVar2 != MPP_OK) {
      _mpp_log_l(2,"hal_h264e_vepu511","set register write failed %d\n","hal_h264e_vepu511_start",
                 (ulong)(uint)MVar2);
      return MVar2;
    }
    MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),7,*(void **)((long)hal + 0x38));
    if (MVar2 == MPP_OK) {
      rd_cfg.reg = (void *)((long)pvVar1 + 0x2c);
      rd_cfg.size = 4;
      rd_cfg.offset = 0x2c;
      MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),5,&rd_cfg);
      if (MVar2 == MPP_OK) {
        rd_cfg.reg = (void *)((long)pvVar1 + 0x1084);
        rd_cfg.size = 0x250;
        rd_cfg.offset = 0x4000;
        MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),5,&rd_cfg);
        if (MVar2 == MPP_OK) {
          MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),0xf,(void *)0x0);
          MVar2 = MPP_OK;
          if (MVar3 != MPP_OK) {
            _mpp_log_l(2,"hal_h264e_vepu511","send cmd failed %d\n","hal_h264e_vepu511_start",
                       (ulong)(uint)MVar3);
            MVar2 = MVar3;
          }
          goto LAB_002230d0;
        }
      }
      uVar4 = (ulong)(uint)MVar2;
      fmt = "set register read failed %d\n";
    }
    else {
      uVar4 = (ulong)(uint)MVar2;
      fmt = "set register offsets failed %d\n";
    }
  }
  else {
LAB_002230ab:
    uVar4 = (ulong)(uint)MVar2;
    fmt = "set register write failed %d\n";
  }
  _mpp_log_l(2,"hal_h264e_vepu511",fmt,"hal_h264e_vepu511_start",uVar4);
  MVar2 = (MPP_RET)uVar4;
LAB_002230d0:
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu511","leave %p\n","hal_h264e_vepu511_start",hal);
  }
  return MVar2;
}

Assistant:

static MPP_RET hal_h264e_vepu511_start(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    HalH264eVepu511Ctx *ctx = (HalH264eVepu511Ctx *)hal;
    HalVepu511RegSet *regs = ctx->regs_set;

    (void) task;

    hal_h264e_dbg_func("enter %p\n", hal);

    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;

        wr_cfg.reg = &regs->reg_ctl;
        wr_cfg.size = sizeof(regs->reg_ctl);
        wr_cfg.offset = VEPU511_CTL_OFFSET;
#if DUMP_REG
        {
            RK_U32 i;
            RK_U32 *reg = (RK_U32)wr_cfg.reg;
            for ( i = 0; i < sizeof(regs->reg_ctl) / sizeof(RK_U32); i++) {
                mpp_log("reg[%d] = 0x%08x\n", i, reg[i]);
            }

        }
#endif
        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &regs->reg_frm;
        wr_cfg.size = sizeof(regs->reg_frm);
        wr_cfg.offset = VEPU511_FRAME_OFFSET;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &regs->reg_rc_roi;
        wr_cfg.size = sizeof(regs->reg_rc_roi);
        wr_cfg.offset = VEPU511_RC_ROI_OFFSET;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &regs->reg_param;
        wr_cfg.size = sizeof(regs->reg_param);
        wr_cfg.offset = VEPU511_PARAM_OFFSET;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &regs->reg_sqi;
        wr_cfg.size = sizeof(regs->reg_sqi);
        wr_cfg.offset = VEPU511_SQI_OFFSET;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &regs->reg_scl;
        wr_cfg.size = sizeof(regs->reg_scl);
        wr_cfg.offset = VEPU511_SCL_OFFSET ;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &regs->reg_osd;
        wr_cfg.size = sizeof(regs->reg_osd);
        wr_cfg.offset = VEPU511_OSD_OFFSET ;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            return ret;
        }

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_OFFS, ctx->offsets);
        if (ret) {
            mpp_err_f("set register offsets failed %d\n", ret);
            break;
        }

        rd_cfg.reg = &regs->reg_ctl.int_sta;
        rd_cfg.size = sizeof(RK_U32);
        rd_cfg.offset = VEPU511_REG_BASE_HW_STATUS;
        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        rd_cfg.reg = &regs->reg_st;
        rd_cfg.size = sizeof(regs->reg_st);
        rd_cfg.offset = VEPU511_STATUS_OFFSET;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        /* send request to hardware */
        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }
    } while (0);

    hal_h264e_dbg_func("leave %p\n", hal);

    return ret;
}